

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcCore.c
# Opt level: O2

void Bdc_ManDecPrintSimple(Bdc_Man_t *p)

{
  Bdc_Fun_t *pBVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  
  puts(" 0 : Const 1");
  lVar4 = 0x48;
  for (uVar5 = 1; (long)uVar5 < (long)p->nNodes; uVar5 = uVar5 + 1) {
    printf(" %d : ",uVar5 & 0xffffffff);
    pBVar1 = p->pNodes;
    if (*(int *)((long)pBVar1 + lVar4 + -0x10) == 2) {
      printf("PI   ");
    }
    else {
      uVar2 = *(ulong *)((long)pBVar1 + lVar4 + -8);
      pcVar3 = "-";
      if ((uVar2 & 1) == 0) {
        pcVar3 = "";
      }
      printf("%s%d &",pcVar3,(long)((uVar2 & 0xfffffffffffffffe) - (long)pBVar1) / 0x38 & 0xffffffff
            );
      uVar2 = *(ulong *)((long)&pBVar1->Type + lVar4);
      pcVar3 = "-";
      if ((uVar2 & 1) == 0) {
        pcVar3 = "";
      }
      printf(" %s%d   ",pcVar3,
             (long)((uVar2 & 0xfffffffffffffffe) - (long)p->pNodes) / 0x38 & 0xffffffff);
    }
    putchar(10);
    lVar4 = lVar4 + 0x38;
  }
  pcVar3 = "-";
  if (((ulong)p->pRoot & 1) == 0) {
    pcVar3 = "";
  }
  printf("Root = %s%d.\n",pcVar3,
         (long)(((ulong)p->pRoot & 0xfffffffffffffffe) - (long)p->pNodes) / 0x38 & 0xffffffff);
  return;
}

Assistant:

void Bdc_ManDecPrintSimple( Bdc_Man_t * p )
{
    Bdc_Fun_t * pNode;
    int i;
    printf( " 0 : Const 1\n" );
    for ( i = 1; i < p->nNodes; i++ )
    {
        printf( " %d : ", i );
        pNode = p->pNodes + i;
        if ( pNode->Type == BDC_TYPE_PI )
            printf( "PI   " );
        else
        {
            printf( "%s%d &", Bdc_IsComplement(pNode->pFan0)? "-":"", Bdc_FunId(p,Bdc_Regular(pNode->pFan0)) );
            printf( " %s%d   ", Bdc_IsComplement(pNode->pFan1)? "-":"", Bdc_FunId(p,Bdc_Regular(pNode->pFan1)) );
        }
//        Extra_PrintBinary( stdout, pNode->puFunc, (1<<p->nVars) );
        printf( "\n" );
    }
    printf( "Root = %s%d.\n", Bdc_IsComplement(p->pRoot)? "-":"", Bdc_FunId(p,Bdc_Regular(p->pRoot)) );
}